

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O1

void pgraph_gen_state_celsius(int cnum,mt19937 *rnd,pgraph_state *state)

{
  undefined8 *puVar1;
  uint *puVar2;
  Register *pRVar3;
  uint32_t uVar4;
  uint uVar5;
  result_type rVar6;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  int j;
  long lVar7;
  int i;
  long lVar8;
  uint32_t (*pauVar9) [4];
  uint32_t (*pauVar10) [3];
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  local_48;
  
  hwtest::pgraph::pgraph_celsius_regs(&local_48,&state->chipset);
  for (; local_48.
         super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_48.
         super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_48.
      super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_48.
           super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    pRVar3 = ((local_48.
               super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
             ._M_t.
             super__Tuple_impl<0UL,_hwtest::pgraph::Register_*,_std::default_delete<hwtest::pgraph::Register>_>
             .super__Head_base<0UL,_hwtest::pgraph::Register_*,_false>._M_head_impl;
    (*pRVar3->_vptr_Register[8])(pRVar3,state,cnum,rnd);
  }
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::~vector(&local_48);
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_begin_end = (uint)rVar6 & 0xf;
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_edge_flag = (uint)rVar6 & 1;
  state->celsius_pipe_unk48 = 0;
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_vtx_state = (uint)rVar6 & 0x70001f3f;
  lVar8 = 0;
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_vtxbuf_offset[lVar8] = (uint)rVar6 & 0xffffffc;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar4 = pgraph_celsius_fixup_vtxbuf_format(state,(int)lVar8,(uint32_t)rVar6);
    state->celsius_pipe_vtxbuf_format[lVar8] = uVar4;
    state->celsius_pipe_vtxbuf_format[lVar8] =
         state->celsius_pipe_vtxbuf_format[0] & 0x1000000 | uVar4 & 0xfeffffff;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  if ((state->chipset).chipset == 0x10) {
    state->celsius_pipe_vtxbuf_format[2] =
         (state->celsius_pipe_vtxbuf_format[2] & 0xfffffffb) +
         (uint)((state->celsius_pipe_vtxbuf_format[1] & 7) != 0) * 4;
  }
  lVar8 = 0;
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_vtx[lVar8] = (uint32_t)rVar6;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x1c);
  lVar8 = 0;
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_junk[lVar8] = (uint32_t)rVar6;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  pauVar9 = state->celsius_pipe_xfrm;
  lVar8 = 0;
  do {
    lVar7 = 0;
    do {
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rnd);
      (*pauVar9)[lVar7] = (uint32_t)rVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar8 = lVar8 + 1;
    pauVar9 = pauVar9 + 1;
  } while (lVar8 != 0x3c);
  pauVar10 = state->celsius_pipe_light_v;
  lVar8 = 0;
  do {
    lVar7 = 0;
    do {
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rnd);
      (*pauVar10)[lVar7] = (uint)rVar6 & 0xfffffc00;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar8 = lVar8 + 1;
    pauVar10 = pauVar10 + 1;
  } while (lVar8 != 0x30);
  lVar8 = 0;
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = (uint)(rVar6 >> 0x17) & 0xff;
    if ((char)(rVar6 >> 0x17) != '\0') {
      if (uVar5 == 0xff) {
        uVar5 = 0x7f800000;
        if ((rVar6 & 1) == 0) {
          uVar5 = 0x7ffffc00;
        }
      }
      else {
        uVar5 = (uint)rVar6 & 0xfffffc00;
      }
    }
    state->celsius_pipe_light_sa[lVar8] = uVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = (uint)(rVar6 >> 0x17) & 0xff;
    if ((char)(rVar6 >> 0x17) != '\0') {
      if (uVar5 == 0xff) {
        uVar5 = 0x7f800000;
        if ((rVar6 & 1) == 0) {
          uVar5 = 0x7ffffc00;
        }
      }
      else {
        uVar5 = (uint)rVar6 & 0xfffffc00;
      }
    }
    state->celsius_pipe_light_sb[lVar8] = uVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x13);
  lVar8 = 0;
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = (uint)(rVar6 >> 0x17) & 0xff;
    if ((char)(rVar6 >> 0x17) != '\0') {
      if (uVar5 == 0xff) {
        uVar5 = 0x7f800000;
        if ((rVar6 & 1) == 0) {
          uVar5 = 0x7ffffc00;
        }
      }
      else {
        uVar5 = (uint)rVar6 & 0xfffffc00;
      }
    }
    state->celsius_pipe_light_sc[lVar8] = uVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xc);
  lVar8 = 0;
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = (uint)(rVar6 >> 0x17) & 0xff;
    if ((char)(rVar6 >> 0x17) != '\0') {
      if (uVar5 == 0xff) {
        uVar5 = 0x7f800000;
        if ((rVar6 & 1) == 0) {
          uVar5 = 0x7ffffc00;
        }
      }
      else {
        uVar5 = (uint)rVar6 & 0xfffffc00;
      }
    }
    state->celsius_pipe_light_sd[lVar8] = uVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xc);
  state->celsius_pipe_light_sa[0] = 0x3f800000;
  state->celsius_pipe_light_sb[0] = 0;
  state->celsius_pipe_light_sc[0] = 0x3f800000;
  state->celsius_pipe_light_sd[0] = 0;
  if ((state->chipset).chipset == 0x10) {
    *(uint32_t *)((long)(state->celsius_pipe_light_v + 0x2f) + 0) = 0;
    *(uint32_t *)((long)(state->celsius_pipe_light_v + 0x2f) + 4) = 0;
    state->celsius_pipe_light_v[0x2f][2] = 0;
    *(uint32_t *)((long)(state->celsius_pipe_xfrm + 0x3b) + 0) = 0;
    *(uint32_t *)((long)(state->celsius_pipe_xfrm + 0x3b) + 4) = 0;
    *(uint32_t *)((long)(state->celsius_pipe_xfrm + 0x3b) + 8) = 0;
    *(uint32_t *)((long)(state->celsius_pipe_xfrm + 0x3b) + 0xc) = 0;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    state->celsius_pipe_broke_ovtx = (bool)((byte)rVar6 & 1);
  }
  else {
    state->celsius_pipe_broke_ovtx = false;
  }
  rVar6 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rnd);
  state->celsius_pipe_ovtx_pos = (uint)rVar6 & 0xf;
  state->celsius_pipe_prev_ovtx_pos = 0xf;
  lVar8 = 0;
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar8) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 4) = (uint)rVar6 & 0xbfffffff;
    *(undefined4 *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 8) = 0;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0xc) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0x10) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0x14) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0x18) = (uint)rVar6 & 0x1ff000;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0x1c) = (uint)rVar6 & 0xbfffffff;
    *(undefined4 *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0x20) = 0;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = (uint)rVar6;
    if ((char)(rVar6 >> 0x17) == '\0') {
      uVar5 = 0;
    }
    else if ((((uint)(rVar6 >> 0x17) & 0xff) == 0xff) && (uVar5 = 0x7f800000, (rVar6 & 1) == 0)) {
      uVar5 = 0x7ffffc00;
    }
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0x24) = uVar5 & 0xfffff800;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(int *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0x28) = (int)rVar6;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0x2c) = (uint)rVar6 & 0xffffff01;
    puVar1 = (undefined8 *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0x3f80000000000000;
    uVar5 = state->bundle_config_b;
    if ((uVar5 >> 9 & 1) == 0) {
      *(uint32_t *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0x18) =
           state->bundle_point_size << 0xc;
    }
    if ((uVar5 & 0x20) == 0) {
      puVar2 = (uint *)((long)state->celsius_pipe_xvtx[0] + lVar8 + 0x2c);
      *puVar2 = *puVar2 & 1;
    }
    lVar8 = lVar8 + 0x40;
  } while (lVar8 != 0xc0);
  lVar8 = 0;
  do {
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 4) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 8) = (uint)rVar6 & 0x1ff000;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 0xc) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 0x10) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 0x14) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 0x18) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 0x1c) = (uint)rVar6 & 0xbfffffff;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(int *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 0x20) = (int)rVar6;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    uVar5 = (uint)(rVar6 >> 0x17) & 0xff;
    if ((char)(rVar6 >> 0x17) != '\0') {
      if (uVar5 == 0xff) {
        uVar5 = 0x7ffffc00;
      }
      else {
        uVar5 = (uint)rVar6 >> 1 & 0x400 | (uint)rVar6 & 0xfffff800;
      }
    }
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 0x24) = uVar5;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(int *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 0x28) = (int)rVar6;
    rVar6 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 0x2c) = (uint)rVar6 & 0xffffff01;
    puVar1 = (undefined8 *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0x3f80000000000000;
    *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 8) =
         (uint)rVar6 << 0x1f | *(uint *)((long)state->celsius_pipe_ovtx[0] + lVar8 + 8) & 0x7fffffff
    ;
    lVar8 = lVar8 + 0x40;
  } while (lVar8 != 0x400);
  return;
}

Assistant:

void pgraph_gen_state_celsius(int cnum, std::mt19937 &rnd, struct pgraph_state *state) {
	for (auto &reg : pgraph_celsius_regs(state->chipset)) {
		reg->gen(state, cnum, rnd);
	}
	state->celsius_pipe_begin_end = rnd() & 0xf;
	state->celsius_pipe_edge_flag = rnd() & 0x1;
	state->celsius_pipe_unk48 = 0;
	state->celsius_pipe_vtx_state = rnd() & 0x70001f3f;
	for (int i = 0; i < 8; i++) {
		state->celsius_pipe_vtxbuf_offset[i] = rnd() & 0x0ffffffc;
		state->celsius_pipe_vtxbuf_format[i] = pgraph_celsius_fixup_vtxbuf_format(state, i, rnd());
		insrt(state->celsius_pipe_vtxbuf_format[i], 24, 1, extr(state->celsius_pipe_vtxbuf_format[0], 24, 1));
	}
	if (state->chipset.chipset == 0x10) {
		if (extr(state->celsius_pipe_vtxbuf_format[1], 0, 3) == 0)
			insrt(state->celsius_pipe_vtxbuf_format[2], 2, 1, 0);
		else
			insrt(state->celsius_pipe_vtxbuf_format[2], 2, 1, 1);
	}
	for (int i = 0; i < 0x1c; i++)
		state->celsius_pipe_vtx[i] = rnd();
	for (int i = 0; i < 4; i++)
		state->celsius_pipe_junk[i] = rnd();
	for (int i = 0; i < 0x3c; i++)
		for (int j = 0; j < 4; j++) {
			state->celsius_pipe_xfrm[i][j] = rnd();
		}
	for (int i = 0; i < 0x30; i++)
		for (int j = 0; j < 3; j++) {
			state->celsius_pipe_light_v[i][j] = rnd() & 0xfffffc00;
		}
	for (int i = 0; i < 3; i++)
		state->celsius_pipe_light_sa[i] = canonical_light_sx_float(rnd());
	for (int i = 0; i < 19; i++)
		state->celsius_pipe_light_sb[i] = canonical_light_sx_float(rnd());
	for (int i = 0; i < 12; i++)
		state->celsius_pipe_light_sc[i] = canonical_light_sx_float(rnd());
	for (int i = 0; i < 12; i++)
		state->celsius_pipe_light_sd[i] = canonical_light_sx_float(rnd());
	state->celsius_pipe_light_sa[0] = 0x3f800000;
	state->celsius_pipe_light_sb[0] = 0;
	state->celsius_pipe_light_sc[0] = 0x3f800000;
	state->celsius_pipe_light_sd[0] = 0;
	if (state->chipset.chipset == 0x10) {
		state->celsius_pipe_xfrm[59][0] = 0;
		state->celsius_pipe_xfrm[59][1] = 0;
		state->celsius_pipe_xfrm[59][2] = 0;
		state->celsius_pipe_xfrm[59][3] = 0;
		state->celsius_pipe_light_v[47][0] = 0;
		state->celsius_pipe_light_v[47][1] = 0;
		state->celsius_pipe_light_v[47][2] = 0;
		state->celsius_pipe_broke_ovtx = rnd() & 1;
	} else {
		state->celsius_pipe_broke_ovtx = false;
	}
	state->celsius_pipe_ovtx_pos = rnd() & 0xf;
	state->celsius_pipe_prev_ovtx_pos = 0xf;
	for (int i = 0; i < 3; i++) {
		// XXX clean this.
		state->celsius_pipe_xvtx[i][0] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][1] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][2] = 0;
		state->celsius_pipe_xvtx[i][3] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][4] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][5] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][6] = rnd() & 0x001ff000;
		state->celsius_pipe_xvtx[i][7] = rnd() & 0xbfffffff;
		state->celsius_pipe_xvtx[i][8] = 0;
		state->celsius_pipe_xvtx[i][9] = canonical_light_sx_float(rnd()) & ~0x400;
		state->celsius_pipe_xvtx[i][10] = rnd();
		state->celsius_pipe_xvtx[i][11] = rnd() & 0xffffff01;
		state->celsius_pipe_xvtx[i][12] = 0;
		state->celsius_pipe_xvtx[i][13] = 0;
		state->celsius_pipe_xvtx[i][14] = 0;
		state->celsius_pipe_xvtx[i][15] = 0x3f800000;
		/* If point params are disabled, point size comes from the global state.
		 * Since we have to load global state before pipe state, there's apparently
		 * no way to cheat here...  */
		if (!extr(state->bundle_config_b, 9, 1))
			state->celsius_pipe_xvtx[i][6] = state->bundle_point_size << 12;
		/* Same for specular enable.  */
		if (!extr(state->bundle_config_b, 5, 1))
			state->celsius_pipe_xvtx[i][11] &= 1;
	}
	for (int i = 0; i < 0x10; i++) {
		// XXX clean this.
		state->celsius_pipe_ovtx[i][0] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][1] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][2] = rnd() & 0x001ff000;
		state->celsius_pipe_ovtx[i][3] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][4] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][5] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][6] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][7] = rnd() & 0xbfffffff;
		state->celsius_pipe_ovtx[i][8] = rnd();
		state->celsius_pipe_ovtx[i][9] = canonical_light_sx_float(canonical_ovtx_fog(rnd()));
		state->celsius_pipe_ovtx[i][10] = rnd();
		state->celsius_pipe_ovtx[i][11] = rnd() & 0xffffff01;
		state->celsius_pipe_ovtx[i][12] = 0;
		state->celsius_pipe_ovtx[i][13] = 0;
		state->celsius_pipe_ovtx[i][14] = 0;
		state->celsius_pipe_ovtx[i][15] = 0x3f800000;
		insrt(state->celsius_pipe_ovtx[i][2], 31, 1, extr(state->celsius_pipe_ovtx[i][11], 0, 1));
	}
}